

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_mpi_mul_mod(mbedtls_ecp_group *grp,mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int local_2c;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  mbedtls_ecp_group *grp_local;
  
  local_2c = mbedtls_mpi_mul_mpi(X,A,B);
  if (local_2c == 0) {
    local_2c = ecp_modp(X,grp);
  }
  return local_2c;
}

Assistant:

static inline int mbedtls_mpi_mul_mod(const mbedtls_ecp_group *grp,
                                      mbedtls_mpi *X,
                                      const mbedtls_mpi *A,
                                      const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(X, A, B));
    MOD_MUL(*X);
cleanup:
    return ret;
}